

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_reader.cpp
# Opt level: O2

void __thiscall diffusion::ShmReader::ShmReader(ShmReader *this,string *shm_name)

{
  uint32_t *puVar1;
  
  (this->super_Reader)._vptr_Reader = (_func_int **)&PTR_can_read_00109d08;
  boost::interprocess::shared_memory_object::shared_memory_object
            (&this->shm_object_,(shm_name->_M_dataplus)._M_p,0);
  boost::interprocess::mapped_region::mapped_region<boost::interprocess::shared_memory_object>
            (&this->shm_region_,&this->shm_object_,read_only,0,0,(void *)0x0,-1);
  this->reader_shm_body_offset_ = 0;
  puVar1 = (uint32_t *)(this->shm_region_).m_base;
  this->shm_header_position_ = (char *)puVar1;
  this->shm_body_position_ = (char *)(puVar1 + 2);
  this->shm_body_size_ = (int)(this->shm_region_).m_size + -8;
  this->writer_shm_body_offset_ = *puVar1;
  return;
}

Assistant:

ShmReader::ShmReader(std::string const & shm_name)
    : shm_object_(boost::interprocess::open_only, shm_name.c_str(), boost::interprocess::read_only),
      shm_region_(shm_object_, boost::interprocess::read_only),
      reader_shm_body_offset_(0) {
    shm_header_position_ = reinterpret_cast<char *>(shm_region_.get_address());
    shm_body_position_ = shm_header_position_ + kShmHeaderLength;
    shm_body_size_ = shm_region_.get_size() - kShmHeaderLength;
    this->update_writer_shm_body_offset();
}